

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swin_transformer.h
# Opt level: O3

void __thiscall
shift_window_transformer::SwinTransformer<float>::forward
          (SwinTransformer<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  pointer pfVar1;
  pointer pfVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  Tensor<float> tmp4;
  Tensor<float> tmp5;
  Tensor<float> tmp6;
  Tensor<float> tmp3;
  Tensor<float> tmp2;
  Tensor<float> tmp1;
  float local_170;
  float local_16c;
  Tensor<float> local_168;
  undefined1 local_138 [24];
  pointer piStack_120;
  pointer local_118;
  pointer piStack_110;
  Tensor<float> *local_100;
  Tensor<float> local_f8;
  Tensor<float> local_c8;
  Tensor<float> local_98;
  Tensor<float> local_68;
  
  local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_c8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_168.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_168.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_118 = (pointer)0x0;
  piStack_110 = (pointer)0x0;
  local_138._16_8_ = (float *)0x0;
  piStack_120 = (pointer)0x0;
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = (float *)0x0;
  local_f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_f8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  StageModule<float>::forward(&this->stage1,input,&local_68);
  StageModule<float>::forward(&this->stage2,&local_68,&local_98);
  StageModule<float>::forward(&this->stage3,&local_98,&local_c8);
  StageModule<float>::forward(&this->stage4,&local_c8,&local_168);
  local_170 = (float)*local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
  local_100 = output;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&piStack_120);
  if (local_168.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish !=
      local_168.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start) {
    uVar5 = local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[2] *
            local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[1];
    local_16c = (float)(int)uVar5;
    lVar6 = 0;
    uVar4 = 0;
    pfVar1 = local_168.super_vector<float,_std::allocator<float>_>.
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pfVar2 = local_168.super_vector<float,_std::allocator<float>_>.
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    do {
      if ((int)uVar5 < 1) {
        local_170 = 0.0;
      }
      else {
        local_170 = 0.0;
        uVar3 = 0;
        do {
          local_170 = local_170 + *(float *)((long)pfVar1 + uVar3 * 4 + lVar6);
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
      local_170 = local_170 / local_16c;
      if (local_138._8_8_ == local_138._16_8_) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)local_138,(iterator)local_138._8_8_,
                   &local_170);
        pfVar1 = local_168.super_vector<float,_std::allocator<float>_>.
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        pfVar2 = local_168.super_vector<float,_std::allocator<float>_>.
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
      }
      else {
        *(float *)local_138._8_8_ = local_170;
        local_138._8_8_ = local_138._8_8_ + 4;
      }
      uVar4 = uVar4 + (long)(int)uVar5;
      lVar6 = lVar6 + (long)(int)uVar5 * 4;
    } while (uVar4 < (ulong)((long)pfVar2 - (long)pfVar1 >> 2));
  }
  LayerNorm<float>::forward(&this->layerNorm,(Tensor<float> *)local_138,&local_f8);
  Linear<float>::forward(&this->linear,&local_f8,local_100);
  if (local_f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_f8.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (piStack_120 != (pointer)0x0) {
    operator_delete(piStack_120,(long)piStack_110 - (long)piStack_120);
  }
  if ((pointer)local_138._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
  }
  if ((float *)local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != (float *)0x0) {
    operator_delete(local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_168.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_168.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_c8.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_98.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_68.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void forward(const Tensor<T> &input, Tensor<T> &output) {
            Tensor<T> tmp1{};
            Tensor<T> tmp2{};
            Tensor<T> tmp3{};
            Tensor<T> tmp4{};
            Tensor<T> tmp5{};
            Tensor<T> tmp6{};
            stage1.forward(input, tmp1);
            stage2.forward(tmp1, tmp2);
            stage3.forward(tmp2, tmp3);
            stage4.forward(tmp3, tmp4);
            tmp5.shape = {tmp4.shape[0]};
            int batch = tmp4.shape[1] * tmp4.shape[2];
            for (int i = 0; i < tmp4.size(); i += batch) {
                T sum = 0;
                for (int j = 0; j < batch; ++j) {
                    sum += tmp4[i + j];
                }
                tmp5.push_back(sum / batch);
            }
            layerNorm.forward(tmp5, tmp6);
            linear.forward(tmp6, output);
        }